

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O3

long Cudd_ReadPeakNodeCount(DdManager *dd)

{
  long lVar1;
  DdNode ***pppDVar2;
  
  pppDVar2 = &dd->memoryList;
  lVar1 = -0x3fe;
  do {
    pppDVar2 = (DdNode ***)*pppDVar2;
    lVar1 = lVar1 + 0x3fe;
  } while (pppDVar2 != (DdNode ***)0x0);
  return lVar1;
}

Assistant:

long
Cudd_ReadPeakNodeCount(
  DdManager * dd)
{
    long count = 0;
    DdNodePtr *scan = dd->memoryList;

    while (scan != NULL) {
        count += DD_MEM_CHUNK;
        scan = (DdNodePtr *) *scan;
    }
    return(count);

}